

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soap_ctrlpt.c
# Opt level: O1

int dom_cmp_name(char *name,IXML_Node *node)

{
  int iVar1;
  parse_status_t pVar2;
  char *__s2;
  size_t slen;
  memptr nameptr;
  memptr dummy;
  char *local_38 [2];
  undefined1 local_28 [16];
  
  if (name == (char *)0x0) {
    __assert_fail("name",".upnp/src/soap/soap_ctrlpt.c",0x4d,
                  "int dom_cmp_name(const char *, IXML_Node *)");
  }
  __s2 = ixmlNode_getNodeName(node);
  if (__s2 == (char *)0x0) {
    iVar1 = -0x68;
  }
  else {
    iVar1 = strcmp(name,__s2);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      slen = strlen(__s2);
      pVar2 = matchstr(__s2,slen,"%s:%s%0",local_28,local_38);
      if ((pVar2 == PARSE_OK) && (iVar1 = strcmp(local_38[0],name), iVar1 == 0)) {
        return 0;
      }
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int dom_cmp_name(
	/* [in] lookup name. */
	const char *name,
	/* [in] xml node. */
	IXML_Node *node)
{
	const DOMString node_name = NULL;
	memptr nameptr;
	memptr dummy;
	int ret_code;

	assert(name);
	assert(node);

	node_name = ixmlNode_getNodeName(node);
	if (node_name == NULL)
		return UPNP_E_OUTOF_MEMORY;
	if (strcmp(name, node_name) == 0)
		ret_code = 0;
	else if (matchstr((char *)node_name,
			 strlen(node_name),
			 "%s:%s%0",
			 &dummy,
			 &nameptr) == PARSE_OK &&
		 strcmp(nameptr.buf, name) == 0)
		ret_code = 0;
	else
		/* names are not the same */
		ret_code = 1;

	return ret_code;
}